

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sync_common.hpp
# Opt level: O1

void __thiscall
oqpi::global_sync_object<oqpi::posix_event<oqpi::event_auto_reset_policy_impl>_>::
global_sync_object<>
          (global_sync_object<oqpi::posix_event<oqpi::event_auto_reset_policy_impl>_> *this,
          string *name,sync_object_creation_options creationOption)

{
  pointer pcVar1;
  
  posix_semaphore_wrapper::posix_semaphore_wrapper
            ((posix_semaphore_wrapper *)this,name,creationOption,0);
  (this->name_)._M_dataplus._M_p = (pointer)&(this->name_).field_2;
  pcVar1 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->name_,pcVar1,pcVar1 + name->_M_string_length);
  return;
}

Assistant:

global_sync_object(const std::string &name, sync_object_creation_options creationOption, _Args &&...args)
            : _Impl(name, creationOption, std::forward<_Args>(args)...)
            , name_(name)
        {}